

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.c
# Opt level: O0

void pnga_msg_brdcst(Integer type,void *buffer,Integer len,Integer root)

{
  void *buf;
  Integer IVar1;
  undefined8 in_RCX;
  void *in_RDX;
  long in_RSI;
  double dVar2;
  int aroot;
  int p_grp;
  long istart;
  void *buffer_ptr;
  long len_small;
  int nsteps;
  int i;
  long bigint;
  long lVar3;
  undefined8 local_38;
  undefined4 local_2c;
  ARMCI_Group *group;
  
  group = (ARMCI_Group *)0x7fffffff;
  lVar3 = 0;
  dVar2 = ceil((double)(long)in_RDX / 2147483647.0);
  for (local_2c = 0; local_2c < (int)dVar2; local_2c = local_2c + 1) {
    buf = (void *)(in_RSI + lVar3);
    local_38 = group;
    if ((long)in_RDX < lVar3 + (long)group) {
      local_38 = (ARMCI_Group *)((long)in_RDX - lVar3);
    }
    IVar1 = pnga_pgroup_get_default();
    if ((int)IVar1 < 1) {
      armci_msg_bcast(buf,(int)((ulong)lVar3 >> 0x20),(int)lVar3);
    }
    else {
      armci_msg_group_bcast_scope
                ((int)((ulong)in_RSI >> 0x20),in_RDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,group)
      ;
    }
    lVar3 = (long)local_38 + lVar3;
  }
  return;
}

Assistant:

void pnga_msg_brdcst(Integer type, void *buffer, Integer len, Integer root)
{
  long bigint = 2147483647L;
  int i, nsteps;//= (int) ceil(((double)len)/((double)bigint));
  long len_small;
  void *buffer_ptr;
  long istart=0;
  int p_grp;
  /*          printf("%ld len %ld bigint %ld  \n",GAme,len,bigint); */
    nsteps = (int) ceil(((double)len)/((double)bigint));
    /*          printf("%ld len %ld bigint %ld  nsteps %d \n",GAme,len,bigint,nsteps); */
  for (i=0; i < nsteps; i++){
    len_small=bigint;
    buffer_ptr=(char *)buffer+istart;
    if (istart+len_small > len) len_small=((long)(len - istart));
    /*               printf("%ld step %d of %d  len= %d total=%ld istart= %ld\n",GAme,(i+1),nsteps,len_small,len,istart); */
    p_grp = (int)pnga_pgroup_get_default();
    if (p_grp > 0) {
#   ifdef MSG_COMMS_MPI
        int aroot = PGRP_LIST[p_grp].inv_map_proc_list[root];
        armci_msg_group_bcast_scope(SCOPE_ALL,buffer_ptr, (int)len_small, aroot,(&(PGRP_LIST[p_grp].group)));
#   endif
    } else {
      armci_msg_bcast(buffer_ptr, (int)len_small, (int)root);
    }
    istart+=len_small;
  }
}